

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int isViableStructurePos(int structureType,Generator *g,int x,int z,uint32_t flags)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  uint64_t uVar8;
  int iVar9;
  int iVar10;
  int x_00;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  char cVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  Layer *pLVar21;
  Layer *pLVar22;
  int z_00;
  long lVar23;
  uint z_01;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  long local_150;
  long local_110;
  Layer *local_108;
  int data [2];
  StructureVariant sv_1;
  int local_d8;
  int local_d0;
  uint64_t r;
  Layer lbiome;
  Layer lshore;
  
  bVar29 = 0;
  iVar27 = x >> 4;
  iVar26 = z >> 4;
  uVar16 = g->dim;
  if (uVar16 == 1) {
    if (structureType == 0x15) {
      if (g->mc < 0x10) {
        return 0;
      }
    }
    else {
      if (structureType != 0x14) {
        return 0;
      }
      if (g->mc < 0xc) {
        return 0;
      }
    }
    iVar26 = getBiomeAt(g,0x10,iVar27,0,iVar26);
    iVar27 = isViableFeatureBiome(g->mc,structureType,iVar26);
    if (iVar27 != 0) {
      return iVar26;
    }
    return 0;
  }
  lVar12 = (long)iVar27;
  lVar23 = (long)iVar26;
  if (uVar16 == 0xffffffff) {
    if ((structureType == 0x12) && (g->mc < 0x16)) {
      return 1;
    }
    iVar9 = g->mc;
    if (iVar9 < 0x13) {
      return 0;
    }
    if (structureType == 0xc) {
      return 1;
    }
    if (structureType != 0x12) {
      if (structureType == 0x13 && 0x15 < iVar9) {
        getVariant((StructureVariant *)&lbiome,0x13,iVar9,g->seed,x,z,-1);
        lVar12 = (long)lbiome.scale._2_2_ + lVar12 * 0x20;
        iVar27 = (int)(((lVar12 + (long)(short)lbiome._8_2_ * 2) -
                       (lVar12 + (long)(short)lbiome._8_2_ * 2 + -1 >> 0x3f)) - 1U >> 3);
        lVar12 = (long)lbiome.layerSalt._2_2_ + lVar23 * 0x20;
        iVar26 = (int)(((lVar12 + (long)(short)lbiome.scale * 2) -
                       (lVar12 + (long)(short)lbiome.scale * 2 + -1 >> 0x3f)) - 1U >> 3);
        iVar9 = (uint)(0x16 < g->mc) << 3;
      }
      else {
        iVar27 = iVar27 * 4 + 2;
        iVar26 = iVar26 * 4 + 2;
        iVar9 = 0;
      }
      iVar26 = getBiomeAt(g,4,iVar27,iVar9,iVar26);
      iVar26 = isViableFeatureBiome(g->mc,structureType,iVar26);
      return iVar26;
    }
    lbiome.getMap._0_4_ =
         x / 0x1b0 - (uint)(0x97b424 < (x * 0x684bda13 + 0x4bda120U >> 4 | x * 0x30000000) && x < 0)
    ;
    lbiome.getMap._4_4_ =
         z / 0x1b0 - (uint)(0x97b424 < (z * 0x684bda13 + 0x4bda120U >> 4 | z * 0x30000000) && z < 0)
    ;
    iVar26 = getStructurePos(0x13,iVar9,g->seed,(int)lbiome.getMap,lbiome.getMap._4_4_,
                             (Pos *)&lbiome);
    if (iVar26 != 0) {
      iVar26 = isViableStructurePos(0x13,g,x,z,flags);
      return (uint)(iVar26 == 0);
    }
    return 1;
  }
  data[1] = g->mc;
  if (data[1] < 0x16) {
    pLVar21 = (g->field_5).field_0.ls.layers + 0x15;
    pLVar22 = &lbiome;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      pLVar22->getMap = pLVar21->getMap;
      pLVar21 = (Layer *)&pLVar21->mc;
      pLVar22 = (Layer *)&pLVar22->mc;
    }
    pLVar21 = (g->field_5).field_0.ls.layers + 0x22;
    pLVar22 = &lshore;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      pLVar22->getMap = pLVar21->getMap;
      pLVar21 = (Layer *)&pLVar21->mc;
      pLVar22 = (Layer *)&pLVar22->mc;
    }
    local_108 = (g->field_5).field_0.entry;
    (g->field_5).field_0.ls.layers[0x15].data = data;
    (g->field_5).field_0.ls.layers[0x15].getMap = mapViableBiome;
    (g->field_5).field_0.ls.layers[0x22].data = data;
    (g->field_5).field_0.ls.layers[0x22].getMap = mapViableShore;
  }
  else {
    local_108 = (Layer *)0x0;
  }
  data[0] = structureType;
  if (0x17 < structureType - 1U) {
switchD_0010d242_caseD_12:
    fprintf(_stderr,"isViableStructurePos: bad structure type %d or dimension %d\n",
            (ulong)(uint)structureType,(ulong)uVar16);
    uVar16 = 0;
    goto LAB_0010d60e;
  }
  uVar25 = x >> 2;
  z_01 = z >> 2;
  uVar24 = 0;
  switch(structureType) {
  case 1:
  case 2:
  case 3:
    goto switchD_0010d242_caseD_1;
  case 4:
    if (data[1] < 0xc) goto LAB_0010d60b;
    goto switchD_0010d242_caseD_1;
  case 5:
    if (data[1] < 0x16) {
      if (data[1] == 0x12) {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
        uVar24 = x & 0xfffffff0U | 9;
        uVar25 = z & 0xfffffff0U | 9;
      }
      else {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
        uVar24 = iVar27 * 4 + 2;
        uVar25 = iVar26 * 4 + 2;
      }
      uVar16 = 0;
      uVar24 = getBiomeAt(g,0,uVar24,0,uVar25);
      if ((((int)uVar24 < 0) ||
          ((((iVar26 = g->mc, 0x23 < uVar24 || ((0x800000006U >> ((ulong)uVar24 & 0x3f) & 1) == 0))
            && (uVar24 != 5 || iVar26 < 0xd)) &&
           ((uVar24 != 0xc || iVar26 < 0x11 && (uVar24 != 0xb1 || iVar26 < 0x16)))))) ||
         ((flags != 0 && (uVar24 != flags)))) goto LAB_0010d60e;
      if (iVar26 < 0xd) {
        uVar16 = 0;
        uVar24 = getBiomeAt(g,1,x & 0xfffffff0U | 2,0,z & 0xfffffff0U | 2);
        if (((int)uVar24 < 0) ||
           (((iVar26 = g->mc, 0x23 < uVar24 || ((0x800000006U >> ((ulong)uVar24 & 0x3f) & 1) == 0))
            && ((uVar24 != 5 || iVar26 < 0xd &&
                ((uVar24 != 0xc || iVar26 < 0x11 && (uVar24 != 0xb1 || iVar26 < 0x16))))))))
        goto LAB_0010d60e;
      }
    }
    else {
      lVar13 = 0;
      uVar16 = 0;
      do {
        if ((flags == 0) || (*(uint32_t *)((long)&DAT_0012ca70 + lVar13) == flags)) {
          uVar24 = *(uint *)((long)&DAT_0012ca70 + lVar13);
          getVariant(&sv_1,5,g->mc,g->seed,x,z,uVar24);
          lVar3 = (long)sv_1.sx + lVar12 * 0x20 + -1 + (long)sv_1.x * 2;
          lVar4 = (long)sv_1.sz + lVar23 * 0x20 + -1 + (long)sv_1.z * 2;
          uVar25 = getBiomeAt(g,0,(int)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 3),0x4f,
                              (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 3));
          if (uVar25 == uVar24) {
LAB_0010d833:
            iVar26 = 6;
            bVar5 = false;
            uVar16 = uVar24;
          }
          else {
            iVar26 = 0;
            bVar5 = true;
            if ((lVar13 == 0) && (uVar25 == 0xb1)) goto LAB_0010d833;
          }
          if (!bVar5) goto LAB_0010d863;
        }
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x14);
      iVar26 = 4;
LAB_0010d863:
      if (iVar26 == 4) goto LAB_0010d60e;
      uVar24 = uVar16;
      if (iVar26 != 6) {
        return uVar16;
      }
    }
    break;
  case 6:
  case 7:
  case 0xe:
    if (data[1] < 0x10) goto LAB_0010d60b;
    goto switchD_0010d242_caseD_1;
  case 8:
    if (data[1] < 0xb) goto LAB_0010d60b;
    if (data[1] == 0xb) {
      uVar16 = 0;
      iVar26 = getBiomeAt(g,1,x & 0xfffffff0U | 8,0,z & 0xfffffff0U | 8);
      if (iVar26 < 0) goto LAB_0010d60e;
      iVar26 = isDeepOcean(iVar26);
joined_r0x0010d552:
      uVar16 = 0;
      if (iVar26 == 0) goto LAB_0010d60e;
    }
    else if (data[1] < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0x990);
      iVar26 = getBiomeAt(g,0,iVar27,0,iVar26);
      if (iVar26 < 0) goto LAB_0010d60b;
      iVar26 = isDeepOcean(iVar26);
      goto joined_r0x0010d552;
    }
    uVar24 = x & 0xfffffff0U | 8;
    uVar25 = z & 0xfffffff0U | 8;
    if (g->mc - 0xcU < 10) {
      iVar26 = areBiomesViable(g,uVar24,0x3f,uVar25,0x10,0x7800001000000,0,0);
LAB_0010db89:
      uVar16 = 0;
      if (iVar26 == 0) goto LAB_0010d60e;
    }
    else if (0x15 < g->mc) {
      iVar26 = getBiomeAt(g,4,(int)uVar24 >> 2,9,(int)uVar25 >> 2);
      iVar26 = isDeepOcean(iVar26);
      goto LAB_0010db89;
    }
    iVar26 = areBiomesViable(g,uVar24,0x3f,uVar25,0x1d,0x7f00001000c81,0,0);
    goto LAB_0010d4e3;
  case 9:
    uVar16 = 0;
    if (data[1] < 0xe) goto LAB_0010d60e;
    if (0x15 < data[1]) {
      uVar24 = getBiomeAt(g,4,(uVar25 & 0xfffffffc) + 1,0x4f,(z_01 & 0xfffffffc) + 1);
      uVar16 = 0;
      if ((int)uVar24 < 0) goto LAB_0010d60e;
      if ((uVar24 & 0x7fffff7f) != 0x1d) goto LAB_0010d60b;
      uVar16 = 0;
      uVar24 = 0;
      if (g->mc < 0xe) goto LAB_0010d60e;
      break;
    }
    iVar26 = areBiomesViable(g,x & 0xfffffff0U | 8,0,z & 0xfffffff0U | 8,0x20,0x20000000,0x20000000,
                             0);
    goto LAB_0010d4e3;
  case 10:
    if (0x10 < data[1]) {
      uVar7 = ((long)(z >> 8) << 4 ^ (long)(x >> 8) ^ g->seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
      do {
        uVar7 = uVar7 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar18 = (int)(uVar7 >> 0x11);
        iVar9 = iVar18 + (int)((uVar7 >> 0x11) / 5) * -5;
      } while (-1 < (iVar9 - iVar18) + -5);
      cVar17 = '\x04';
      if (iVar9 == 0) {
        iVar9 = iVar26 + -10;
        iVar19 = (uint)(0x15 < data[1]) * 2 + 0x20;
        iVar18 = iVar26 + 10;
        iVar10 = iVar9 / iVar19 - (uint)(iVar9 % iVar19 != 0 && iVar26 < 10);
        uVar16 = (uint)(iVar18 % iVar19 != 0 && iVar26 < -10);
        if (iVar10 <= (int)(iVar18 / iVar19 - uVar16)) {
          iVar1 = iVar27 + 10;
          iVar2 = iVar27 + -10;
          iVar28 = iVar1 / iVar19 - (uint)(iVar1 % iVar19 != 0 && iVar27 < -10);
          iVar20 = iVar2 / iVar19 - (uint)(iVar2 % iVar19 != 0 && iVar27 < 10);
          uVar7 = (ulong)(0x15 < data[1]) * 2 + 0x18;
          local_150 = (long)iVar10;
          local_d0 = -(int)uVar7;
          local_110 = (long)iVar20 * 0x4f9939f508 + local_150 * 0x1ef1565bd5 + 0x9e7f70;
          do {
            if (iVar20 <= iVar28) {
              local_d8 = (int)local_150 * iVar19;
              lVar13 = local_110;
              iVar10 = iVar20 * iVar19;
              iVar11 = (iVar28 - iVar20) + 1;
              do {
                uVar14 = (g->seed + lVar13 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                uVar15 = uVar14 >> 0x11;
                x_00 = ((int)uVar15 + iVar10 + (int)((uVar15 & 0x7fffffff) / uVar7) * local_d0) *
                       0x10;
                iVar6 = x_00 >> 4;
                if ((iVar6 < iVar2) || (iVar1 < iVar6)) {
LAB_0010ddbe:
                  cVar17 = '\0';
                  bVar5 = true;
                }
                else {
                  z_00 = ((int)((uVar14 * 0x5deece66d + 0xb >> 0x11 & 0x7fffffff) % uVar7) +
                         local_d8) * 0x10;
                  iVar6 = z_00 >> 4;
                  if ((iVar6 < iVar9) || (iVar18 < iVar6)) goto LAB_0010ddbe;
                  cVar17 = '\x04';
                  if (g->mc < 0x13) {
                    bVar5 = false;
                    iVar6 = isViableStructurePos(5,g,x_00,z_00,0);
                    cVar17 = '\x04';
                    if (iVar6 == 0) goto LAB_0010ddbe;
                  }
                  else {
                    bVar5 = false;
                  }
                }
                if (!bVar5) goto LAB_0010d448;
                iVar10 = iVar10 + iVar19;
                lVar13 = lVar13 + 0x4f9939f508;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
            local_150 = local_150 + 1;
            local_110 = local_110 + 0x1ef1565bd5;
          } while ((iVar18 / iVar19 - uVar16) + 1 != (int)local_150);
        }
        if (g->mc < 0x16) {
          if (g->mc < 0x13) {
            (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
            uVar16 = x & 0xfffffff0U | 9;
            uVar24 = z & 0xfffffff0U | 9;
          }
          else {
            (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
            uVar16 = iVar27 * 4 + 2;
            uVar24 = iVar26 * 4 + 2;
          }
        }
        else {
          uVar8 = chunkGenerateRnd(g->seed,iVar27,iVar26);
          uVar24 = ((uint)(uVar8 * 0x5deece66d + 0xb >> 0x2e) & 3) << 3;
          lVar12 = lVar12 * 0x20 + *(long *)(&DAT_0012e078 + uVar24);
          uVar16 = (uint)((ulong)(lVar12 - (lVar12 >> 0x3f)) >> 3);
          lVar12 = lVar23 * 0x20 + *(long *)(&DAT_0012e058 + uVar24);
          uVar24 = (uint)((ulong)(lVar12 - (lVar12 >> 0x3f)) >> 3);
        }
        iVar26 = getBiomeAt(g,0,uVar16,0x4f,uVar24);
        cVar17 = '\x04';
        if (-1 < iVar26) {
          iVar26 = isViableFeatureBiome(g->mc,10,iVar26);
          cVar17 = (iVar26 != 0) * '\x02' + '\x04';
        }
      }
LAB_0010d448:
      if (cVar17 != '\x04') {
        uVar24 = 0;
        if (cVar17 != '\x06') {
          return 0;
        }
        break;
      }
    }
    goto LAB_0010d60b;
  case 0xb:
  case 0xc:
    uVar16 = 0;
    uVar24 = 0;
    if (data[1] < 0x13) goto LAB_0010d60e;
    break;
  case 0xd:
    if (data[1] < 0x17) goto LAB_0010d60b;
LAB_0010d567:
    getVariant(&sv_1,structureType,data[1],g->seed,x,z,-1);
    lVar12 = (long)sv_1.sx + lVar12 * 0x20;
    lVar23 = (long)sv_1.sz + lVar23 * 0x20;
    iVar26 = getBiomeAt(g,4,(int)(((lVar12 + (long)sv_1.x * 2) -
                                  (lVar12 + (long)sv_1.x * 2 + -1 >> 0x3f)) - 1U >> 3),
                        (int)sv_1.y >> 2,
                        (int)(((lVar23 + (long)sv_1.z * 2) -
                              (lVar23 + (long)sv_1.z * 2 + -1 >> 0x3f)) - 1U >> 3));
    if (iVar26 < 0) goto LAB_0010d60b;
    goto LAB_0010d4d5;
  case 0xf:
    break;
  case 0x10:
    if (data[1] < 0x13) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
      uVar25 = x;
      z_01 = z;
    }
    else if (data[1] < 0x16) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
    }
    iVar26 = getBiomeAt(g,0,uVar25,0x4f,z_01);
    uVar16 = 0;
    uVar24 = 0;
    if (iVar26 != 2) goto LAB_0010d60e;
    break;
  case 0x11:
    uVar16 = 0;
    uVar24 = 0;
    if (data[1] < 0x15) goto LAB_0010d60e;
    break;
  default:
    goto switchD_0010d242_caseD_12;
  case 0x17:
    if (data[1] < 0x19) goto LAB_0010d60b;
switchD_0010d242_caseD_1:
    if (data[1] < 0x13) {
      (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xfc0);
      uVar16 = x & 0xfffffff0U | 9;
      uVar24 = z & 0xfffffff0U | 9;
    }
    else {
      if (data[1] < 0x16) {
        (g->field_5).field_0.entry = (Layer *)((long)&g->field_5 + 0xd38);
      }
      uVar16 = iVar27 * 4 + 2;
      uVar24 = iVar26 * 4 + 2;
    }
    iVar26 = getBiomeAt(g,0,uVar16,0x4f,uVar24);
    uVar16 = 0;
    if (iVar26 < 0) goto LAB_0010d60e;
LAB_0010d4d5:
    iVar26 = isViableFeatureBiome(g->mc,structureType,iVar26);
LAB_0010d4e3:
    uVar16 = 0;
    uVar24 = 0;
    if (iVar26 == 0) goto LAB_0010d60e;
    break;
  case 0x18:
    if (0x19 < data[1]) goto LAB_0010d567;
LAB_0010d60b:
    uVar16 = 0;
    goto LAB_0010d60e;
  }
  uVar16 = uVar24 + (uVar24 == 0);
LAB_0010d60e:
  if (g->mc < 0x16) {
    pLVar21 = &lbiome;
    pLVar22 = (g->field_5).field_0.ls.layers + 0x15;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      pLVar22->getMap = pLVar21->getMap;
      pLVar21 = (Layer *)((long)pLVar21 + (ulong)bVar29 * -0x10 + 8);
      pLVar22 = (Layer *)((long)pLVar22 + ((ulong)bVar29 * -2 + 1) * 8);
    }
    pLVar21 = &lshore;
    pLVar22 = (g->field_5).field_0.ls.layers + 0x22;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      pLVar22->getMap = pLVar21->getMap;
      pLVar21 = (Layer *)((long)pLVar21 + (ulong)bVar29 * -0x10 + 8);
      pLVar22 = (Layer *)((long)pLVar22 + ((ulong)bVar29 * -2 + 1) * 8);
    }
    (g->field_5).field_0.entry = local_108;
  }
  return uVar16;
}

Assistant:

int isViableStructurePos(int structureType, Generator *g, int x, int z, uint32_t flags)
{
    int approx = 0; // enables approximation levels
    int viable = 0;

    int64_t chunkX = x >> 4;
    int64_t chunkZ = z >> 4;

    // Structures are positioned at the chunk origin, but the biome check is
    // performed near the middle of the chunk [(9,9) in 1.13, TODO: check 1.7]
    // In 1.16 the biome check is always performed at (2,2) with layer scale=4.
    int sampleX, sampleZ, sampleY;
    int id;


    if (g->dim == DIM_NETHER)
    {
        if (structureType == Fortress && g->mc <= MC_1_17)
            return 1;
        if (g->mc <= MC_1_15)
            return 0;
        if (structureType == Ruined_Portal_N)
            return 1;
        if (structureType == Fortress)
        {   // in 1.18+ fortresses generate everywhere, where bastions don't
            StructureConfig sc;
            if (!getStructureConfig(Fortress, g->mc, &sc))
                return 0;
            Pos rp = {
                floordiv(x, sc.regionSize << 4),
                floordiv(z, sc.regionSize << 4)
            };
            if (!getStructurePos(Bastion, g->mc, g->seed, rp.x, rp.z, &rp))
                return 1;
            return !isViableStructurePos(Bastion, g, x, z, flags);
        }
        sampleY = 0;
        if (g->mc >= MC_1_18 && structureType == Bastion)
        {
            StructureVariant sv;
            getVariant(&sv, Bastion, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
            if (g->mc >= MC_1_19_2)
                sampleY = 33 >> 2; // nether biomes don't actually vary in Y
        }
        else
        {
            sampleX = (chunkX * 4) + 2;
            sampleZ = (chunkZ * 4) + 2;
        }
        id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        return isViableFeatureBiome(g->mc, structureType, id);
    }
    else if (g->dim == DIM_END)
    {
        switch (structureType)
        {
        case End_City:
            if (g->mc <= MC_1_8) return 0;
            break;
        case End_Gateway:
            if (g->mc <= MC_1_12) return 0;
            break;
        default:
            return 0;
        }
        // End biomes vary only on a per-chunk scale (1:16)
        // voronoi pre-1.15 shouldn't matter for End Cities as the check will
        // be near the chunk center
        id = getBiomeAt(g, 16, chunkX, 0, chunkZ);
        return isViableFeatureBiome(g->mc, structureType, id) ? id : 0;
    }

    // Overworld

    Layer lbiome, lshore, *entry = 0;
    int data[2] = { structureType, g->mc };

    if (g->mc <= MC_1_17)
    {
        lbiome = g->ls.layers[L_BIOME_256];
        lshore = g->ls.layers[L_SHORE_16];
        entry = g->entry;

        g->ls.layers[L_BIOME_256].data = (void*) data;
        g->ls.layers[L_BIOME_256].getMap = mapViableBiome;
        g->ls.layers[L_SHORE_16].data = (void*) data;
        g->ls.layers[L_SHORE_16].getMap = mapViableShore;
    }

    switch (structureType)
    {
    case Trail_Ruins:
        if (g->mc <= MC_1_19) goto L_not_viable;
        goto L_feature;
    case Ocean_Ruin:
    case Shipwreck:
    case Treasure:
        if (g->mc <= MC_1_12) goto L_not_viable;
        goto L_feature;
    case Igloo:
        if (g->mc <= MC_1_8) goto L_not_viable;
        goto L_feature;
    case Desert_Pyramid:
    case Jungle_Pyramid:
    case Swamp_Hut:
L_feature:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Desert_Well:
        if (g->mc <= MC_1_15)
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = x;
            sampleZ = z;
        }
        else
        {
            if (g->mc <= MC_1_17)
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = x >> 2;
            sampleZ = z >> 2;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Village:
        if (g->mc <= MC_1_17)
        {
            if (g->mc == MC_1_15)
            {   // exclusively in MC_1_15, villages used the same biome check
                // as other structures
                g->entry = &g->ls.layers[L_VORONOI_1];
                sampleX = chunkX * 16 + 9;
                sampleZ = chunkZ * 16 + 9;
            }
            else
            {
                g->entry = &g->ls.layers[L_RIVER_MIX_4];
                sampleX = chunkX * 4 + 2;
                sampleZ = chunkZ * 4 + 2;
            }
            id = getBiomeAt(g, 0, sampleX, 0, sampleZ);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
            if (flags && (uint32_t) id != flags)
                goto L_not_viable;
            if (g->mc <= MC_1_9)
            {   // before MC_1_10 villages did not spread into invalid biomes,
                // which could cause them to fail to generate on the first
                // check at block (2, 2) in the starting chunk
                sampleX = chunkX * 16 + 2;
                sampleZ = chunkZ * 16 + 2;
                id = getBiomeAt(g, 1, sampleX, 0, sampleZ);
                if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                    goto L_not_viable;
            }
            viable = id; // biome for viablility, useful for further analysis
            goto L_viable;
        }
        else
        {   // In 1.18 village types are checked separtely...
            const int vv[] = { plains, desert, savanna, taiga, snowy_tundra };
            size_t i;
            for (i = 0; i < sizeof(vv)/sizeof(int); i++) {
                if (flags && flags != (uint32_t) vv[i])
                    continue;
                StructureVariant sv;
                getVariant(&sv, Village, g->mc, g->seed, x, z, vv[i]);
                sampleX = (chunkX*32 + 2*sv.x + sv.sx-1) / 2 >> 2;
                sampleZ = (chunkZ*32 + 2*sv.z + sv.sz-1) / 2 >> 2;
                sampleY = 319 >> 2;
                id = getBiomeAt(g, 0, sampleX, sampleY, sampleZ);
                if (id == vv[i] || (id == meadow && vv[i] == plains)) {
                    viable = vv[i];
                    goto L_viable;
                }
            }
            goto L_not_viable;
        }

    case Outpost:
    {
        if (g->mc <= MC_1_13)
            goto L_not_viable;
        uint64_t rng = g->seed;
        setAttemptSeed(&rng, chunkX, chunkZ);
        if (nextInt(&rng, 5) != 0)
            goto L_not_viable;
        // look for villages within 10 chunks
        StructureConfig vilconf;
        if (!getStructureConfig(Village, g->mc, &vilconf))
            goto L_not_viable;
        int cx0 = (chunkX-10), cx1 = (chunkX+10);
        int cz0 = (chunkZ-10), cz1 = (chunkZ+10);
        int rx0 = floordiv(cx0, vilconf.regionSize);
        int rx1 = floordiv(cx1, vilconf.regionSize);
        int rz0 = floordiv(cz0, vilconf.regionSize);
        int rz1 = floordiv(cz1, vilconf.regionSize);
        int rx, rz;
        for (rz = rz0; rz <= rz1; rz++)
        {
            for (rx = rx0; rx <= rx1; rx++)
            {
                Pos p = getFeaturePos(vilconf, g->seed, rx, rz);
                int cx = p.x >> 4, cz = p.z >> 4;
                if (cx >= cx0 && cx <= cx1 && cz >= cz0 && cz <= cz1)
                {
                    if (g->mc >= MC_1_16_1)
                        goto L_not_viable;
                    if (isViableStructurePos(Village, g, p.x, p.z, 0))
                        goto L_not_viable;
                }
            }
        }
        if (g->mc >= MC_1_18)
        {
            rng = chunkGenerateRnd(g->seed, chunkX, chunkZ);
            switch (nextInt(&rng, 4)) {
                case 0: sampleX = +15; sampleZ = +15; break;
                case 1: sampleX = -15; sampleZ = +15; break;
                case 2: sampleX = -15; sampleZ = -15; break;
                case 3: sampleX = +15; sampleZ = -15; break;
                default: return 0; // unreachable
            }
            sampleX = (chunkX * 32 + sampleX) / 2 >> 2;
            sampleZ = (chunkZ * 32 + sampleZ) / 2 >> 2;
        }
        else if (g->mc >= MC_1_16_1)
        {
            g->entry = &g->ls.layers[L_RIVER_MIX_4];
            sampleX = chunkX * 4 + 2;
            sampleZ = chunkZ * 4 + 2;
        }
        else
        {
            g->entry = &g->ls.layers[L_VORONOI_1];
            sampleX = chunkX * 16 + 9;
            sampleZ = chunkZ * 16 + 9;
        }
        id = getBiomeAt(g, 0, sampleX, 319>>2, sampleZ);
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;
    }

    case Monument:
        if (g->mc <= MC_1_7)
            goto L_not_viable;
        else if (g->mc == MC_1_8)
        {   // In 1.8 monuments require only a single deep ocean block.
            id = getBiomeAt(g, 1, chunkX * 16 + 8, 0, chunkZ * 16 + 8);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        else if (g->mc <= MC_1_17)
        {   // Monuments require two viability checks with the ocean layer
            // branch => worth checking for potential deep ocean beforehand.
            g->entry = &g->ls.layers[L_SHORE_16];
            id = getBiomeAt(g, 0, chunkX, 0, chunkZ);
            if (id < 0 || !isDeepOcean(id))
                goto L_not_viable;
        }
        sampleX = chunkX * 16 + 8;
        sampleZ = chunkZ * 16 + 8;
        if (g->mc >= MC_1_9 && g->mc <= MC_1_17)
        {   // check for deep ocean center
            if (!areBiomesViable(g, sampleX, 63, sampleZ, 16, g_monument_biomes2, 0, approx))
                goto L_not_viable;
        }
        else if (g->mc >= MC_1_18)
        {   // check is done at y level of ocean floor - approx. with y = 36
            id = getBiomeAt(g, 4, sampleX>>2, 36>>2, sampleZ>>2);
            if (!isDeepOcean(id))
                goto L_not_viable;
        }
        if (areBiomesViable(g, sampleX, 63, sampleZ, 29, g_monument_biomes1, 0, approx))
            goto L_viable;
        goto L_not_viable;

    case Mansion:
        if (g->mc <= MC_1_10)
            goto L_not_viable;
        if (g->mc <= MC_1_17)
        {
            sampleX = chunkX * 16 + 8;
            sampleZ = chunkZ * 16 + 8;
            uint64_t b = (1ULL << dark_forest);
            uint64_t m = (1ULL << (dark_forest_hills-128));
            if (!areBiomesViable(g, sampleX, 0, sampleZ, 32, b, m, approx))
                goto L_not_viable;
        }
        else
        {   // In 1.18 the generation gets the minimum surface height among the
            // four structure corners (note structure has rotation).
            // This minimum height has to be y >= 60. The biome check is done
            // at the center position at that height.
            // TODO: get surface height
            sampleX = chunkX * 16 + 7;
            sampleZ = chunkZ * 16 + 7;
            id = getBiomeAt(g, 4, sampleX>>2, 319>>2, sampleZ>>2);
            if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
                goto L_not_viable;
        }
        goto L_viable;

    case Ruined_Portal:
    case Ruined_Portal_N:
        if (g->mc <= MC_1_15)
            goto L_not_viable;
        goto L_viable;

    case Geode:
        if (g->mc <= MC_1_16)
            goto L_not_viable;
        goto L_viable;

    case Ancient_City:
        if (g->mc <= MC_1_18) goto L_not_viable;
        goto L_jigsaw;

    case Trial_Chambers:
        if (g->mc <= MC_1_20) goto L_not_viable;
L_jigsaw:
        {
            StructureVariant sv;
            getVariant(&sv, structureType, g->mc, g->seed, x, z, -1);
            sampleX = (chunkX*32 + 2*sv.x + sv.sx - 1) / 2 >> 2;
            sampleZ = (chunkZ*32 + 2*sv.z + sv.sz - 1) / 2 >> 2;
            sampleY = sv.y >> 2;
            id = getBiomeAt(g, 4, sampleX, sampleY, sampleZ);
        }
        if (id < 0 || !isViableFeatureBiome(g->mc, structureType, id))
            goto L_not_viable;
        goto L_viable;

    case Mineshaft:
        goto L_viable;

    default:
        fprintf(stderr,
                "isViableStructurePos: bad structure type %d or dimension %d\n",
                structureType, g->dim);
        goto L_not_viable;
    }

L_viable:
    if (!viable)
        viable = 1;
L_not_viable:
    if (g->mc <= MC_1_17)
    {
        g->ls.layers[L_BIOME_256] = lbiome;
        g->ls.layers[L_SHORE_16] = lshore;
        g->entry = entry;
    }
    return viable;
}